

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

int4 __thiscall
PcodeInjectLibrarySleigh::registerDynamicInject
          (PcodeInjectLibrarySleigh *this,InjectPayload *payload)

{
  size_type sVar1;
  InjectPayload *pIStack_18;
  int4 id;
  InjectPayload *payload_local;
  PcodeInjectLibrarySleigh *this_local;
  
  pIStack_18 = payload;
  payload_local = (InjectPayload *)this;
  sVar1 = std::vector<InjectPayload_*,_std::allocator<InjectPayload_*>_>::size
                    (&(this->super_PcodeInjectLibrary).injection);
  std::vector<InjectPayload_*,_std::allocator<InjectPayload_*>_>::push_back
            (&(this->super_PcodeInjectLibrary).injection,&stack0xffffffffffffffe8);
  return (int4)sVar1;
}

Assistant:

int4 PcodeInjectLibrarySleigh::registerDynamicInject(InjectPayload *payload)

{
  int4 id = injection.size();
  injection.push_back(payload);
  return id;
}